

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O1

void TTD::NSSnapValues::AssertSnapEquiv
               (TopLevelCommonBodyResolveInfo *fbInfo1,TopLevelCommonBodyResolveInfo *fbInfo2,
               TTDCompareMap *compareMap)

{
  bool bVar1;
  ulong uVar2;
  
  TTDCompareMap::DiagnosticAssert
            (compareMap,fbInfo1->ScriptContextLogId == fbInfo2->ScriptContextLogId);
  TTDCompareMap::DiagnosticAssert(compareMap,fbInfo1->TopLevelBodyCtr == fbInfo2->TopLevelBodyCtr);
  bVar1 = TTStringEQForDiagnostics(&fbInfo1->FunctionName,&fbInfo2->FunctionName);
  TTDCompareMap::DiagnosticAssert(compareMap,bVar1);
  TTDCompareMap::DiagnosticAssert(compareMap,fbInfo1->ModuleId == fbInfo2->ModuleId);
  TTDCompareMap::DiagnosticAssert(compareMap,fbInfo1->SourceContextId == fbInfo2->SourceContextId);
  bVar1 = TTStringEQForDiagnostics(&fbInfo1->SourceUri,&fbInfo2->SourceUri);
  TTDCompareMap::DiagnosticAssert(compareMap,bVar1);
  TTDCompareMap::DiagnosticAssert(compareMap,fbInfo1->IsUtf8 == fbInfo2->IsUtf8);
  TTDCompareMap::DiagnosticAssert(compareMap,fbInfo1->ByteLength == fbInfo2->ByteLength);
  if (fbInfo1->ByteLength != 0) {
    uVar2 = 0;
    do {
      TTDCompareMap::DiagnosticAssert
                (compareMap,fbInfo1->SourceBuffer[uVar2] == fbInfo2->SourceBuffer[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < fbInfo1->ByteLength);
  }
  TTDCompareMap::DiagnosticAssert
            (compareMap,(fbInfo1->ScopeChainInfo).ScopeCount == (fbInfo2->ScopeChainInfo).ScopeCount
            );
  return;
}

Assistant:

void AssertSnapEquiv(const TopLevelCommonBodyResolveInfo* fbInfo1, const TopLevelCommonBodyResolveInfo* fbInfo2, TTDCompareMap& compareMap)
        {
            compareMap.DiagnosticAssert(fbInfo1->ScriptContextLogId == fbInfo2->ScriptContextLogId);
            compareMap.DiagnosticAssert(fbInfo1->TopLevelBodyCtr == fbInfo2->TopLevelBodyCtr);
            compareMap.DiagnosticAssert(TTStringEQForDiagnostics(fbInfo1->FunctionName, fbInfo2->FunctionName));

            compareMap.DiagnosticAssert(fbInfo1->ModuleId == fbInfo2->ModuleId);
            compareMap.DiagnosticAssert(fbInfo1->SourceContextId == fbInfo2->SourceContextId);

            compareMap.DiagnosticAssert(TTStringEQForDiagnostics(fbInfo1->SourceUri, fbInfo2->SourceUri));

            compareMap.DiagnosticAssert(fbInfo1->IsUtf8 == fbInfo2->IsUtf8);
            compareMap.DiagnosticAssert(fbInfo1->ByteLength == fbInfo2->ByteLength);

            for(uint32 i = 0; i < fbInfo1->ByteLength; ++i)
            {
                compareMap.DiagnosticAssert(fbInfo1->SourceBuffer[i] == fbInfo2->SourceBuffer[i]);
            }

            AssertSnapEquiv(fbInfo1->ScopeChainInfo, fbInfo2->ScopeChainInfo, compareMap);
        }